

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O1

double __thiscall ON_Line::MinimumDistanceTo(ON_Line *this,ON_3dPoint *P)

{
  bool bVar1;
  double dVar2;
  double t;
  double local_40;
  double local_38;
  ON_3dPoint local_30;
  
  bVar1 = ClosestPointTo(this,P,&local_40);
  if (bVar1) {
    if (0.0 <= local_40) {
      if (1.0 < local_40) {
        local_40 = 1.0;
      }
    }
    else {
      local_40 = 0.0;
    }
    PointAt(&local_30,this,local_40);
    dVar2 = ON_3dPoint::DistanceTo(&local_30,P);
  }
  else {
    local_38 = ON_3dPoint::DistanceTo(&this->from,P);
    dVar2 = ON_3dPoint::DistanceTo(&this->to,P);
    if (local_38 <= dVar2) {
      return local_38;
    }
  }
  return dVar2;
}

Assistant:

double ON_Line::MinimumDistanceTo( const ON_3dPoint& P ) const
{
  double d, t;
  if (ClosestPointTo(P,&t))
  {
    if ( t < 0.0 ) t = 0.0; else if (t > 1.0) t = 1.0;
    d = PointAt(t).DistanceTo(P);
  }
  else
  {
    // degenerate line
    d = from.DistanceTo(P);
    t = to.DistanceTo(P);
    if ( t < d )
      d = t;
  }
  return d;
}